

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O0

void __thiscall mdsplit::mdsplitter::list_doc_outsiders(mdsplitter *this)

{
  bool bVar1;
  path *ppVar2;
  iterator __first;
  iterator __last;
  pointer this_00;
  value_type *pvVar3;
  reference this_01;
  istream *piVar4;
  ostream *poVar5;
  string local_4a8;
  string local_488;
  undefined1 local_465;
  int local_464;
  undefined1 local_460 [3];
  bool is_mdsplit_file;
  smatch sm;
  undefined1 local_438 [6];
  bool inside_ignoreblock;
  bool inside_codeblock;
  string current_line;
  istream local_3f8 [8];
  ifstream fin;
  path *outsider_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  *__range1_1;
  regex ignore_end_regex;
  regex ignore_begin_regex;
  regex gen_with_mdsplit_regex;
  bool section_exists;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  local_148;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  it;
  undefined1 local_118 [8];
  path outsider;
  path local_c8;
  directory_entry *local_a0;
  directory_entry *p;
  undefined1 local_88 [8];
  recursive_directory_iterator __end1;
  undefined1 local_68 [8];
  recursive_directory_iterator __begin1;
  recursive_directory_iterator local_48;
  recursive_directory_iterator *local_38;
  recursive_directory_iterator *__range1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> outsiders;
  bool first;
  mdsplitter *this_local;
  
  outsiders.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
         &__range1);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&local_48,&this->output_dir_);
  local_38 = &local_48;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount,local_38);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_68,(recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&p,local_38);
  std::filesystem::__cxx11::end((recursive_directory_iterator *)local_88);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&p);
  do {
    bVar1 = std::filesystem::__cxx11::operator!=
                      ((recursive_directory_iterator *)local_68,
                       (recursive_directory_iterator *)local_88);
    if (!bVar1) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)local_88);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)local_68);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_48);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 &ignore_begin_regex._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 " *<!-- Generated with mdsplit: https://github.com/alandefreitas/mdsplit --> *",
                 0x10);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 &ignore_end_regex._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount," *<!-- START mdsplit-ignore --> *",0x10);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__range1_1,
                 " *<!-- END mdsplit-ignore --> *",0x10);
      __end1_1 = std::
                 vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                          *)&__range1);
      outsider_1 = (path *)std::
                           vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                           ::end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                  *)&__range1);
      do {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                            *)&outsider_1);
        if (!bVar1) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__range1_1);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     &ignore_end_regex._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     &ignore_begin_regex._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::
          vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
          ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                   *)&__range1);
          return;
        }
        this_01 = __gnu_cxx::
                  __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                  ::operator*(&__end1_1);
        std::filesystem::__cxx11::path::string((string *)((long)&current_line.field_2 + 8),this_01);
        std::ifstream::ifstream(local_3f8,(string *)(current_line.field_2._M_local_buf + 8),_S_in);
        std::__cxx11::string::~string((string *)(current_line.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_438);
        sm._M_begin._M_current._7_1_ = 0;
        sm._M_begin._M_current._6_1_ = 0;
        do {
          piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (local_3f8,(string *)local_438);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
          if (!bVar1) break;
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_460);
          bVar1 = is_codeblock((string *)local_438);
          if (bVar1) {
            sm._M_begin._M_current._7_1_ = (sm._M_begin._M_current._7_1_ & 1) != 1;
          }
          if ((sm._M_begin._M_current._7_1_ & 1) == 0) {
            bVar1 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_438,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                               &ignore_end_regex._M_automaton.
                                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,0);
            if (bVar1) {
              sm._M_begin._M_current._6_1_ = 1;
              local_464 = 6;
            }
            else {
              bVar1 = std::
                      regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_438,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__range1_1
                                 ,0);
              if (bVar1) {
                sm._M_begin._M_current._6_1_ = 0;
                local_464 = 6;
              }
              else if ((sm._M_begin._M_current._6_1_ & 1) == 0) {
                local_465 = std::
                            regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_438,
                                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        *)local_460,
                                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       &ignore_begin_regex._M_automaton.
                                        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,0);
                if (!(bool)local_465) goto LAB_0015d0b2;
                if ((this->trace_ & 1U) != 0) {
                  poVar5 = std::operator<<((ostream *)&std::cout,
                                           "Outsider doc file generated by mdsplit: ");
                  std::filesystem::__cxx11::path::string(&local_488,this_01);
                  poVar5 = std::operator<<(poVar5,(string *)&local_488);
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                  std::__cxx11::string::~string((string *)&local_488);
                }
                if ((this->erase_old_mdsplit_files_ & 1U) != 0) {
                  if ((this->trace_ & 1U) != 0) {
                    poVar5 = std::operator<<((ostream *)&std::cout,"Removing ");
                    std::filesystem::__cxx11::path::string(&local_4a8,this_01);
                    poVar5 = std::operator<<(poVar5,(string *)&local_4a8);
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    std::__cxx11::string::~string((string *)&local_4a8);
                  }
                  std::filesystem::remove(this_01);
                }
                local_464 = 7;
              }
              else {
                local_464 = 6;
              }
            }
          }
          else {
LAB_0015d0b2:
            local_464 = 0;
          }
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_460);
        } while ((local_464 == 0) || (local_464 == 6));
        std::__cxx11::string::~string((string *)local_438);
        std::ifstream::~ifstream(local_3f8);
        __gnu_cxx::
        __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
        ::operator++(&__end1_1);
      } while( true );
    }
    local_a0 = (directory_entry *)
               std::filesystem::__cxx11::recursive_directory_iterator::operator*
                         ((recursive_directory_iterator *)local_68);
    ppVar2 = std::filesystem::__cxx11::directory_entry::path(local_a0);
    std::filesystem::__cxx11::path::extension(&local_c8,ppVar2);
    std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
              ((path *)&outsider._M_cmpts,(char (*) [4])0x16c2b8,auto_format);
    bVar1 = std::filesystem::__cxx11::operator==(&local_c8,(path *)&outsider._M_cmpts);
    std::filesystem::__cxx11::path::~path((path *)&outsider._M_cmpts);
    std::filesystem::__cxx11::path::~path(&local_c8);
    if (bVar1) {
      ppVar2 = std::filesystem::__cxx11::directory_entry::path(local_a0);
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative((path *)local_118,ppVar2);
      std::filesystem::__cxx11::path::~path((path *)&it);
      __first = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::begin
                          (&this->sections_);
      __last = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::end
                         (&this->sections_);
      local_148 = std::
                  find_if<__gnu_cxx::__normal_iterator<mdsplit::mdsection*,std::vector<mdsplit::mdsection,std::allocator<mdsplit::mdsection>>>,mdsplit::mdsplitter::list_doc_outsiders()::__0>
                            (__first._M_current,__last._M_current,(path *)local_118);
      gen_with_mdsplit_regex._M_automaton.
      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::end
                     (&this->sections_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_148,
                         (__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                          *)&gen_with_mdsplit_regex._M_automaton.
                             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
      if (bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                  ::operator->(&local_148);
        bVar1 = mdsection::has_content(this_00,false,false);
        if (!bVar1) goto LAB_0015caa7;
      }
      else {
LAB_0015caa7:
        if ((outsiders.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          if ((this->trace_ & 1U) != 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "\n# The following .md files were not generated by mdsplit in this run"
                                    );
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<((ostream *)&std::cout,"# Please make sure that is on purpose:")
            ;
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          outsiders.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        }
        if ((this->trace_ & 1U) != 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Outsider doc file: ");
          pvVar3 = std::filesystem::__cxx11::path::c_str((path *)local_118);
          poVar5 = std::operator<<(poVar5,pvVar3);
          std::operator<<(poVar5,'\n');
        }
        std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
        emplace_back<std::filesystem::__cxx11::path&>
                  ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                    *)&__range1,(path *)local_118);
      }
      std::filesystem::__cxx11::path::~path((path *)local_118);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_68);
  } while( true );
}

Assistant:

void mdsplitter::list_doc_outsiders() {
        bool first = true;
        std::vector<fs::path> outsiders;
        for (auto &p : fs::recursive_directory_iterator(output_dir_)) {
            if (p.path().extension() == ".md") {
                fs::path outsider = fs::relative(p.path(), fs::current_path());
                auto it = std::find_if(
                    sections_.begin(), sections_.end(),
                    [&](const mdsection &s) { return s.filepath == outsider; });
                bool section_exists = it != sections_.end();
                if (!section_exists || !it->has_content()) {
                    if (first) {
                        if (trace_) {
                            std::cout << "\n# The following .md files were not "
                                         "generated by mdsplit in this run"
                                      << std::endl;
                            std::cout
                                << "# Please make sure that is on purpose:"
                                << std::endl;
                        }
                        first = false;
                    }
                    if (trace_) {
                        std::cout << "Outsider doc file: " << outsider.c_str()
                                  << '\n';
                    }
                    outsiders.emplace_back(outsider);
                }
            }
        }

        // Remove outsiders generated by mdsplit
        std::regex gen_with_mdsplit_regex{
            R"( *<!-- Generated with mdsplit: https://github.com/alandefreitas/mdsplit --> *)"};
        std::regex ignore_begin_regex{R"( *<!-- START mdsplit-ignore --> *)"};
        std::regex ignore_end_regex{R"( *<!-- END mdsplit-ignore --> *)"};

        for (const auto &outsider : outsiders) {
            std::ifstream fin(outsider.string());
            std::string current_line;
            bool inside_codeblock = false;
            bool inside_ignoreblock = false;
            while (std::getline(fin, current_line)) {
                std::smatch sm;
                if (is_codeblock(current_line)) {
                    inside_codeblock = 1 - inside_codeblock;
                }
                if (!inside_codeblock) {
                    if (std::regex_match(current_line, ignore_begin_regex)) {
                        inside_ignoreblock = true;
                        continue;
                    } else if (std::regex_match(current_line,
                                                ignore_end_regex)) {
                        inside_ignoreblock = false;
                        continue;
                    }
                    if (inside_ignoreblock) {
                        continue;
                    }

                    bool is_mdsplit_file = std::regex_search(
                        current_line, sm, gen_with_mdsplit_regex);
                    if (is_mdsplit_file) {
                        if (trace_) {
                            std::cout
                                << "Outsider doc file generated by mdsplit: "
                                << outsider.string() << std::endl;
                        }
                        if (erase_old_mdsplit_files_) {
                            if (trace_) {
                                std::cout << "Removing " << outsider.string()
                                          << std::endl;
                            }
                            fs::remove(outsider);
                        }
                        break;
                    }
                }
            }
        }
    }